

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

VirtualIterator<Inferences::InductionContext> __thiscall
Inferences::InductionContextFn::operator()
          (InductionContextFn *this,
          pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
          *arg)

{
  Inference *pIVar1;
  Clause *cl;
  pointer ppTVar2;
  Term *term;
  char cVar3;
  bool bVar4;
  bool bVar5;
  Literal *val;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *in_RDX;
  SingletonIterator<Inferences::InductionContext> *i;
  CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
  *i_00;
  TermList st1;
  TermList st2;
  SubtermIterator sti2;
  SubtermIterator sti1;
  InductionContext ctx;
  VirtualIterator<Inferences::InductionContext> local_3c8;
  VirtualIterator<Inferences::InductionContext> local_3c0;
  uint local_3b4;
  Term *local_3b0;
  undefined1 local_3a8 [16];
  pointer local_398;
  IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_> local_340;
  Lib local_2e8 [8];
  SubtermIterator local_2e0;
  SubtermIterator local_2b8;
  SingletonIterator<Inferences::InductionContext> local_290;
  InductionContext local_238;
  InductionContext local_1e8;
  SingletonIterator<Inferences::InductionContext> local_198;
  SingletonIterator<Inferences::InductionContext> local_140;
  InductionContext local_e8;
  CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
  local_98;
  
  cl = (Clause *)
       (arg->first).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_3b4 = *(uint *)&(cl->super_Unit)._inference >> 0x15 & 0x1f;
  if (local_3b4 == 0) {
    InductionContext::InductionContext
              ((InductionContext *)local_3a8,in_RDX,
               (Literal *)
               (arg->first).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,cl);
    Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::Set
              ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)&local_340);
    Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::insert
              ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)&local_340,
               (Literal *)
               (arg->first).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    while (cVar3 = (**(code **)&(*in_RDX[1].
                                  super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_weight)(),
          cVar3 != '\0') {
      (**(code **)&(*in_RDX[1].super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                     _M_impl.super__Vector_impl_data._M_start)->_maxRedLen)(&local_290);
      ppTVar2 = local_290._el._indTerms.
                super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
                ((SmartPtr<Indexing::ResultSubstitution> *)&local_290);
      bVar5 = Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::contains
                        ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)&local_340,
                         (Literal *)ppTVar2[2]);
      if (!bVar5) {
        val = Kernel::Literal::complementaryLiteral((Literal *)ppTVar2[2]);
        bVar5 = Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::contains
                          ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)&local_340,val);
        if (!bVar5) {
          Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::insert
                    ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)&local_340,
                     (Literal *)ppTVar2[2]);
          if ((*(ushort *)&(((Clause *)ppTVar2[3])->super_Unit)._inference.field_0x2 & 0x3e0) == 0)
          {
            InductionContext::insert
                      ((InductionContext *)local_3a8,(Clause *)ppTVar2[3],(Literal *)ppTVar2[2]);
          }
        }
      }
    }
    InductionContext::InductionContext(&local_238,(InductionContext *)local_3a8);
    Lib::getSingletonIterator<Inferences::InductionContext>(&local_198,&local_238);
    Lib::pvi<Lib::SingletonIterator<Inferences::InductionContext>>((Lib *)this,&local_198);
    InductionContext::~InductionContext(&local_198._el);
    InductionContext::~InductionContext(&local_238);
    Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::~Set
              ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)&local_340);
    InductionContext::~InductionContext((InductionContext *)local_3a8);
  }
  else {
    Lib::VirtualIterator<Inferences::InductionContext>::getEmpty();
    ppTVar2 = (in_RDX->super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((((ulong)((long)(in_RDX->super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2) < 9) &&
        (*(int *)((arg->first).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 1) != 0)) &&
       (local_3b0 = *ppTVar2, (*(uint *)&local_3b0->field_0xc & 0xfffffff) != 0)) {
      while( true ) {
        cVar3 = (**(code **)&(*in_RDX[1].
                               super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_weight)();
        if (cVar3 == '\0') break;
        (**(code **)&(*in_RDX[1].super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_maxRedLen)
                  ((SmartPtr<Indexing::ResultSubstitution> *)local_3a8);
        ppTVar2 = local_398;
        Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
                  ((SmartPtr<Indexing::ResultSubstitution> *)local_3a8);
        if (((local_3b4 == (ppTVar2[3]->_functor >> 0x15 & 0x1f)) &&
            (ppTVar2[3] !=
             (Term *)(arg->first).
                     super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                     super__Vector_impl_data._M_start)) &&
           (term = (Term *)(arg->first).
                           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish,
           term->_functor == ppTVar2[2]->_functor)) {
          Kernel::SubtermIterator::SubtermIterator(&local_2b8,term);
          Kernel::SubtermIterator::SubtermIterator(&local_2e0,ppTVar2[2]);
          bVar5 = false;
          while (bVar4 = Kernel::SubtermIterator::hasNext(&local_2b8), bVar4) {
            Kernel::SubtermIterator::hasNext(&local_2e0);
            local_2b8._used = true;
            local_3a8._0_8_ =
                 (*(TermList ***)
                   ((long)local_2b8._stack._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>.
                          _M_head_impl + 0x10))[-1]->_content;
            local_2e0._used = true;
            local_340._iter._0_8_ =
                 (*(TermList ***)
                   ((long)local_2e0._stack._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>.
                          _M_head_impl + 0x10))[-1]->_content;
            if (local_3a8._0_8_ != local_340._iter._0_8_) {
              if ((bVar5) ||
                 ((bVar5 = Kernel::TermList::containsSubterm
                                     ((TermList *)local_3a8,(TermList)local_340._iter._0_8_),
                  !bVar5 || local_3b0 != (Term *)local_340._iter._0_8_ &&
                  (bVar5 = Kernel::TermList::containsSubterm
                                     ((TermList *)&local_340,(TermList)local_3a8._0_8_),
                  !bVar5 || local_3b0 != (Term *)local_3a8._0_8_)))) goto LAB_00400801;
              Kernel::SubtermIterator::right(&local_2b8);
              bVar5 = true;
              Kernel::SubtermIterator::right(&local_2e0);
            }
          }
          if (bVar5) {
            InductionContext::InductionContext
                      (&local_1e8,in_RDX,
                       (Literal *)
                       (arg->first).
                       super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (Clause *)
                       (arg->first).
                       super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                       super__Vector_impl_data._M_start);
            InductionContext::insert(&local_1e8,(Clause *)ppTVar2[3],(Literal *)ppTVar2[2]);
            local_3c8._core = (IteratorCore<Inferences::InductionContext> *)this->_premise;
            if ((Clause *)local_3c8._core != (Clause *)0x0) {
              pIVar1 = &(((Clause *)local_3c8._core)->super_Unit)._inference;
              *(int *)pIVar1 = *(int *)pIVar1 + 1;
            }
            InductionContext::InductionContext(&local_e8,&local_1e8);
            Lib::getSingletonIterator<Inferences::InductionContext>(&local_140,&local_e8);
            local_3c0._core = local_3c8._core;
            if ((Clause *)local_3c8._core != (Clause *)0x0) {
              *(int *)&(local_3c8._core)->_refCnt = (local_3c8._core)->_refCnt + 1;
            }
            Lib::SingletonIterator<Inferences::InductionContext>::SingletonIterator
                      (&local_290,&local_140);
            Lib::SingletonIterator<Inferences::InductionContext>::SingletonIterator
                      ((SingletonIterator<Inferences::InductionContext> *)local_3a8,&local_290);
            Lib::iterTraits<Lib::SingletonIterator<Inferences::InductionContext>>
                      (&local_340,(Lib *)local_3a8,i);
            InductionContext::~InductionContext((InductionContext *)(local_3a8 + 8));
            Lib::
            CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
            ::CatIterator((CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
                           *)local_3a8,&local_3c0,&local_340);
            Lib::
            iterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>>>>
                      ((IterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>_>
                        *)&local_98,(Lib *)local_3a8,i_00);
            Lib::
            CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
            ::~CatIterator((CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
                            *)local_3a8);
            InductionContext::~InductionContext(&local_340._iter._el);
            InductionContext::~InductionContext(&local_290._el);
            Lib::VirtualIterator<Inferences::InductionContext>::~VirtualIterator(&local_3c0);
            Lib::
            pvi<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>>>>>
                      (local_2e8,
                       (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>_>
                        *)&local_98);
            Lib::VirtualIterator<Inferences::InductionContext>::operator=
                      ((VirtualIterator<Inferences::InductionContext> *)this,
                       (VirtualIterator<Inferences::InductionContext> *)local_2e8);
            Lib::VirtualIterator<Inferences::InductionContext>::~VirtualIterator
                      ((VirtualIterator<Inferences::InductionContext> *)local_2e8);
            Lib::
            CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
            ::~CatIterator(&local_98);
            InductionContext::~InductionContext(&local_140._el);
            InductionContext::~InductionContext(&local_e8);
            Lib::VirtualIterator<Inferences::InductionContext>::~VirtualIterator(&local_3c8);
            InductionContext::~InductionContext(&local_1e8);
          }
LAB_00400801:
          Kernel::SubtermIterator::~SubtermIterator(&local_2e0);
          Kernel::SubtermIterator::~SubtermIterator(&local_2b8);
        }
      }
    }
  }
  return (VirtualIterator<Inferences::InductionContext>)
         (IteratorCore<Inferences::InductionContext> *)this;
}

Assistant:

VirtualIterator<InductionContext> operator()(pair<std::vector<Term*>, VirtualIterator<QueryRes<ResultSubstitutionSP, TermLiteralClause>>> arg) {
    auto indDepth = _premise->inference().inductionDepth();
    // heuristic 2
    if (indDepth) {
      auto res = VirtualIterator<InductionContext>::getEmpty();
      // TODO make this work for multiple induction terms
      ASS(arg.first.size() >= 1)
      if (arg.first.size() > 1) {
        return res;
      }
      auto indTerm = arg.first[0];
      // check for complex term and non-equality
      if (_lit->isEquality() || !indTerm->arity()) {
        return res;
      }
      while (arg.second.hasNext()) {
        auto& tqr = *arg.second.next().data;
        if (indDepth != tqr.clause->inference().inductionDepth()) {
          continue;
        }
        // check for different clauses and same topmost functors
        if (tqr.clause == _premise || _lit->functor() != tqr.literal->functor()) {
          continue;
        }
        bool match = false;
        SubtermIterator sti1(_lit);
        SubtermIterator sti2(tqr.literal);
        while (sti1.hasNext()) {
          ALWAYS(sti2.hasNext());
          auto st1 = sti1.next();
          auto st2 = sti2.next();
          if (st1 != st2) {
            // if the two terms are not equal, we check that
            // - no other non-equal pair of terms have been processed (match)
            // - one of them contains the other and the contained one is the induction term
            if (match ||
              !((st1.containsSubterm(st2) && st2.term() == indTerm) ||
                (st2.containsSubterm(st1) && st1.term() == indTerm)))
            {
              match = false;
              break;
            }
            sti1.right();
            sti2.right();
            match = true;
          }
        }
        if (!match) {
          continue;
        }
        InductionContext ctx(arg.first, _lit, _premise);
        ctx.insert(tqr.clause, tqr.literal);
        res = pvi(concatIters(res, getSingletonIterator(ctx)));
      }
      return res;
    // heuristic 1
    } else {
      InductionContext ctx(arg.first, _lit, _premise);
      Set<Literal*,SharedTermHash> lits;
      lits.insert(_lit);
      while (arg.second.hasNext()) {
        auto& tqr = *arg.second.next().data;
        // TODO: having the same literal multiple times or its complement has unwanted effects
        // in the clausification/resolution part, so avoid it for now
        if (lits.contains(tqr.literal) || lits.contains(Literal::complementaryLiteral(tqr.literal))) {
          continue;
        }
        lits.insert(tqr.literal);
        if (indDepth != tqr.clause->inference().inductionDepth()) {
          continue;
        }
        ctx.insert(tqr.clause, tqr.literal);
      }
      return pvi(getSingletonIterator(ctx));
    }
  }